

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int mbedtls_sha1_self_test(int verbose)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  mbedtls_sha1_context local_4b8;
  uchar sha1sum [20];
  uchar buf [1024];
  
  local_4b8.buffer[0x34] = '\0';
  local_4b8.buffer[0x35] = '\0';
  local_4b8.buffer[0x36] = '\0';
  local_4b8.buffer[0x37] = '\0';
  local_4b8.buffer[0x38] = '\0';
  local_4b8.buffer[0x39] = '\0';
  local_4b8.buffer[0x3a] = '\0';
  local_4b8.buffer[0x3b] = '\0';
  local_4b8.buffer[0x3c] = '\0';
  local_4b8.buffer[0x3d] = '\0';
  local_4b8.buffer[0x3e] = '\0';
  local_4b8.buffer[0x3f] = '\0';
  local_4b8.buffer[0x24] = '\0';
  local_4b8.buffer[0x25] = '\0';
  local_4b8.buffer[0x26] = '\0';
  local_4b8.buffer[0x27] = '\0';
  local_4b8.buffer[0x28] = '\0';
  local_4b8.buffer[0x29] = '\0';
  local_4b8.buffer[0x2a] = '\0';
  local_4b8.buffer[0x2b] = '\0';
  local_4b8.buffer[0x2c] = '\0';
  local_4b8.buffer[0x2d] = '\0';
  local_4b8.buffer[0x2e] = '\0';
  local_4b8.buffer[0x2f] = '\0';
  local_4b8.buffer[0x30] = '\0';
  local_4b8.buffer[0x31] = '\0';
  local_4b8.buffer[0x32] = '\0';
  local_4b8.buffer[0x33] = '\0';
  local_4b8.buffer[0x14] = '\0';
  local_4b8.buffer[0x15] = '\0';
  local_4b8.buffer[0x16] = '\0';
  local_4b8.buffer[0x17] = '\0';
  local_4b8.buffer[0x18] = '\0';
  local_4b8.buffer[0x19] = '\0';
  local_4b8.buffer[0x1a] = '\0';
  local_4b8.buffer[0x1b] = '\0';
  local_4b8.buffer[0x1c] = '\0';
  local_4b8.buffer[0x1d] = '\0';
  local_4b8.buffer[0x1e] = '\0';
  local_4b8.buffer[0x1f] = '\0';
  local_4b8.buffer[0x20] = '\0';
  local_4b8.buffer[0x21] = '\0';
  local_4b8.buffer[0x22] = '\0';
  local_4b8.buffer[0x23] = '\0';
  local_4b8.buffer[4] = '\0';
  local_4b8.buffer[5] = '\0';
  local_4b8.buffer[6] = '\0';
  local_4b8.buffer[7] = '\0';
  local_4b8.buffer[8] = '\0';
  local_4b8.buffer[9] = '\0';
  local_4b8.buffer[10] = '\0';
  local_4b8.buffer[0xb] = '\0';
  local_4b8.buffer[0xc] = '\0';
  local_4b8.buffer[0xd] = '\0';
  local_4b8.buffer[0xe] = '\0';
  local_4b8.buffer[0xf] = '\0';
  local_4b8.buffer[0x10] = '\0';
  local_4b8.buffer[0x11] = '\0';
  local_4b8.buffer[0x12] = '\0';
  local_4b8.buffer[0x13] = '\0';
  local_4b8.state[2] = 0;
  local_4b8.state[3] = 0;
  local_4b8.state[4] = 0;
  local_4b8.buffer[0] = '\0';
  local_4b8.buffer[1] = '\0';
  local_4b8.buffer[2] = '\0';
  local_4b8.buffer[3] = '\0';
  local_4b8.total[0] = 0;
  local_4b8.total[1] = 0;
  local_4b8.state[0] = 0;
  local_4b8.state[1] = 0;
  lVar1 = 0;
  do {
    if (lVar1 == 3) {
      iVar2 = 0;
      if (verbose != 0) {
        putchar(10);
      }
LAB_0010f314:
      mbedtls_sha1_free(&local_4b8);
      return iVar2;
    }
    if (verbose != 0) {
      printf("  SHA-1 test #%d: ",(ulong)((int)lVar1 + 1));
    }
    local_4b8.total[0] = 0;
    local_4b8.total[1] = 0;
    local_4b8.state[0] = 0x67452301;
    local_4b8.state[1] = 0xefcdab89;
    local_4b8.state[2] = 0x98badcfe;
    local_4b8.state[3] = 0x10325476;
    local_4b8.state[4] = 0xc3d2e1f0;
    if (lVar1 == 2) {
      memset(buf,0x61,1000);
      iVar2 = 1000;
      while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
        mbedtls_sha1_update_ret(&local_4b8,buf,1000);
      }
    }
    else {
      mbedtls_sha1_update_ret(&local_4b8,sha1_test_buf[lVar1],sha1_test_buflen[lVar1]);
    }
    mbedtls_sha1_finish_ret(&local_4b8,sha1sum);
    iVar2 = bcmp(sha1sum,sha1_test_sum + lVar1,0x14);
    if (iVar2 != 0) {
      iVar2 = 1;
      if (verbose != 0) {
        puts("failed");
      }
      goto LAB_0010f314;
    }
    if (verbose != 0) {
      puts("passed");
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

int mbedtls_sha1_self_test( int verbose )
{
    int i, j, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha1sum[20];
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init( &ctx );

    /*
     * SHA-1
     */
    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  SHA-1 test #%d: ", i + 1 );

        if( ( ret = mbedtls_sha1_starts_ret( &ctx ) ) != 0 )
            goto fail;

        if( i == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
            {
                ret = mbedtls_sha1_update_ret( &ctx, buf, buflen );
                if( ret != 0 )
                    goto fail;
            }
        }
        else
        {
            ret = mbedtls_sha1_update_ret( &ctx, sha1_test_buf[i],
                                           sha1_test_buflen[i] );
            if( ret != 0 )
                goto fail;
        }

        if( ( ret = mbedtls_sha1_finish_ret( &ctx, sha1sum ) ) != 0 )
            goto fail;

        if( memcmp( sha1sum, sha1_test_sum[i], 20 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    goto exit;

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

exit:
    mbedtls_sha1_free( &ctx );

    return( ret );
}